

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O3

void __thiscall
cmCMakePresetsGraph::BuildPreset::BuildPreset(BuildPreset *this,BuildPreset *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  pointer pbVar4;
  undefined3 uVar5;
  undefined2 uVar6;
  _Storage<int,_true> _Var7;
  optional<bool> oVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__BuildPreset_0084cde8;
  paVar1 = &(this->ConfigurePreset).field_2;
  (this->ConfigurePreset)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->ConfigurePreset)._M_dataplus._M_p;
  paVar9 = &(param_1->ConfigurePreset).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar9) {
    uVar3 = *(undefined8 *)((long)&(param_1->ConfigurePreset).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->ConfigurePreset).field_2 + 8) = uVar3;
  }
  else {
    (this->ConfigurePreset)._M_dataplus._M_p = pcVar2;
    (this->ConfigurePreset).field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  (this->ConfigurePreset)._M_string_length = (param_1->ConfigurePreset)._M_string_length;
  (param_1->ConfigurePreset)._M_dataplus._M_p = (pointer)paVar9;
  (param_1->ConfigurePreset)._M_string_length = 0;
  (param_1->ConfigurePreset).field_2._M_local_buf[0] = '\0';
  uVar5 = *(undefined3 *)
           &(param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>.field_0x5;
  (this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = (param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged;
  *(undefined3 *)
   &(this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    field_0x5 = uVar5;
  uVar6 = *(undefined2 *)&param_1->field_0xfa;
  _Var7 = (param_1->Jobs).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_payload;
  this->InheritConfigureEnvironment =
       (_Optional_base<bool,_true,_true>)
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>;
  *(undefined2 *)&this->field_0xfa = uVar6;
  (this->Jobs).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload = _Var7;
  pbVar4 = (param_1->Targets).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->Targets).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  (this->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->Targets).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->Targets).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &(this->Configuration).field_2;
  (this->Configuration)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->Configuration)._M_dataplus._M_p;
  paVar9 = &(param_1->Configuration).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar9) {
    uVar3 = *(undefined8 *)((long)&(param_1->Configuration).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar9->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Configuration).field_2 + 8) = uVar3;
  }
  else {
    (this->Configuration)._M_dataplus._M_p = pcVar2;
    (this->Configuration).field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  (this->Configuration)._M_string_length = (param_1->Configuration)._M_string_length;
  (param_1->Configuration)._M_dataplus._M_p = (pointer)paVar9;
  (param_1->Configuration)._M_string_length = 0;
  (param_1->Configuration).field_2._M_local_buf[0] = '\0';
  oVar8.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->Verbose).super__Optional_base<bool,_true,_true>;
  this->CleanFirst =
       (_Optional_base<bool,_true,_true>)
       (param_1->CleanFirst).super__Optional_base<bool,_true,_true>;
  this->Verbose =
       (optional<bool>)
       oVar8.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  pbVar4 = (param_1->NativeToolOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->NativeToolOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
  (this->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->NativeToolOptions).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->NativeToolOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>._M_payload.
  super__Optional_payload_base<PackageResolveMode> =
       (param_1->ResolvePackageReferences).super__Optional_base<PackageResolveMode,_true,_true>.
       _M_payload.super__Optional_payload_base<PackageResolveMode>;
  return;
}

Assistant:

BuildPreset(BuildPreset&& /*other*/) = default;